

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_devs.c
# Opt level: O0

int main(void)

{
  FILE *__stream;
  uint uVar1;
  PaDeviceIndex PVar2;
  PaVersionInfo *pPVar3;
  PaDeviceInfo *pPVar4;
  PaHostApiInfo *pPVar5;
  char *pcVar6;
  bool bVar7;
  PaHostApiInfo *hostInfo_1;
  PaHostApiInfo *hostInfo;
  undefined1 local_60 [4];
  PaError err;
  PaStreamParameters outputParameters;
  PaStreamParameters inputParameters;
  PaDeviceInfo *deviceInfo;
  int defaultDisplayed;
  int numDevices;
  int i;
  
  hostInfo._4_4_ = Pa_Initialize();
  if (hostInfo._4_4_ == 0) {
    uVar1 = Pa_GetVersion();
    printf("PortAudio version: 0x%08X\n",(ulong)uVar1);
    pPVar3 = Pa_GetVersionInfo();
    printf("Version text: \'%s\'\n",pPVar3->versionText);
    hostInfo._4_4_ = Pa_GetDeviceCount();
    if (-1 < (int)hostInfo._4_4_) {
      printf("Number of devices = %d\n",(ulong)hostInfo._4_4_);
      for (defaultDisplayed = 0; defaultDisplayed < (int)hostInfo._4_4_;
          defaultDisplayed = defaultDisplayed + 1) {
        pPVar4 = Pa_GetDeviceInfo(defaultDisplayed);
        printf("--------------------------------------- device #%d\n",(ulong)(uint)defaultDisplayed)
        ;
        PVar2 = Pa_GetDefaultInputDevice();
        if (defaultDisplayed == PVar2) {
          printf("[ Default Input");
          bVar7 = true;
        }
        else {
          pPVar5 = Pa_GetHostApiInfo(pPVar4->hostApi);
          bVar7 = defaultDisplayed == pPVar5->defaultInputDevice;
          if (bVar7) {
            pPVar5 = Pa_GetHostApiInfo(pPVar4->hostApi);
            printf("[ Default %s Input",pPVar5->name);
          }
        }
        PVar2 = Pa_GetDefaultOutputDevice();
        if (defaultDisplayed == PVar2) {
          pcVar6 = "[";
          if (bVar7) {
            pcVar6 = ",";
          }
          printf(pcVar6);
          printf(" Default Output");
          bVar7 = true;
        }
        else {
          pPVar5 = Pa_GetHostApiInfo(pPVar4->hostApi);
          if (defaultDisplayed == pPVar5->defaultOutputDevice) {
            pPVar5 = Pa_GetHostApiInfo(pPVar4->hostApi);
            pcVar6 = "[";
            if (bVar7) {
              pcVar6 = ",";
            }
            printf(pcVar6);
            printf(" Default %s Output",pPVar5->name);
            bVar7 = true;
          }
        }
        if (bVar7) {
          printf(" ]\n");
        }
        printf("Name                        = %s\n",pPVar4->name);
        pPVar5 = Pa_GetHostApiInfo(pPVar4->hostApi);
        printf("Host API                    = %s\n",pPVar5->name);
        printf("Max inputs = %d",(ulong)(uint)pPVar4->maxInputChannels);
        printf(", Max outputs = %d\n",(ulong)(uint)pPVar4->maxOutputChannels);
        printf("Default low input latency   = %8.4f\n",pPVar4->defaultLowInputLatency);
        printf("Default low output latency  = %8.4f\n",pPVar4->defaultLowOutputLatency);
        printf("Default high input latency  = %8.4f\n",pPVar4->defaultHighInputLatency);
        printf("Default high output latency = %8.4f\n",pPVar4->defaultHighOutputLatency);
        printf("Default sample rate         = %8.2f\n",pPVar4->defaultSampleRate);
        outputParameters.hostApiSpecificStreamInfo._0_4_ = defaultDisplayed;
        outputParameters.hostApiSpecificStreamInfo._4_4_ = pPVar4->maxInputChannels;
        local_60 = (undefined1  [4])defaultDisplayed;
        err = pPVar4->maxOutputChannels;
        outputParameters.device = 8;
        outputParameters.channelCount = 0;
        outputParameters.sampleFormat = 0;
        outputParameters.suggestedLatency = 0.0;
        if (0 < (int)outputParameters.hostApiSpecificStreamInfo._4_4_) {
          printf("Supported standard sample rates\n for half-duplex 16 bit %d channel input = \n",
                 (ulong)outputParameters.hostApiSpecificStreamInfo._4_4_);
          PrintSupportedStandardSampleRates
                    ((PaStreamParameters *)&outputParameters.hostApiSpecificStreamInfo,
                     (PaStreamParameters *)0x0);
        }
        if (0 < err) {
          printf("Supported standard sample rates\n for half-duplex 16 bit %d channel output = \n",
                 (ulong)(uint)err);
          PrintSupportedStandardSampleRates
                    ((PaStreamParameters *)0x0,(PaStreamParameters *)local_60);
        }
        if ((0 < (int)outputParameters.hostApiSpecificStreamInfo._4_4_) && (0 < err)) {
          printf("Supported standard sample rates\n for full-duplex 16 bit %d channel input, %d channel output = \n"
                 ,(ulong)outputParameters.hostApiSpecificStreamInfo._4_4_,(ulong)(uint)err);
          PrintSupportedStandardSampleRates
                    ((PaStreamParameters *)&outputParameters.hostApiSpecificStreamInfo,
                     (PaStreamParameters *)local_60);
        }
      }
      Pa_Terminate();
      printf("----------------------------------------------\n");
      return 0;
    }
    printf("ERROR: Pa_GetDeviceCount returned 0x%x\n",(ulong)hostInfo._4_4_);
  }
  else {
    printf("ERROR: Pa_Initialize returned 0x%x\n",(ulong)hostInfo._4_4_);
  }
  Pa_Terminate();
  fprintf(_stderr,"Error number: %d\n",(ulong)hostInfo._4_4_);
  __stream = _stderr;
  pcVar6 = Pa_GetErrorText(hostInfo._4_4_);
  fprintf(__stream,"Error message: %s\n",pcVar6);
  return hostInfo._4_4_;
}

Assistant:

int main(void)
{
    int     i, numDevices, defaultDisplayed;
    const   PaDeviceInfo *deviceInfo;
    PaStreamParameters inputParameters, outputParameters;
    PaError err;

    
    err = Pa_Initialize();
    if( err != paNoError )
    {
        printf( "ERROR: Pa_Initialize returned 0x%x\n", err );
        goto error;
    }
    
    printf( "PortAudio version: 0x%08X\n", Pa_GetVersion());
    printf( "Version text: '%s'\n", Pa_GetVersionInfo()->versionText );

    numDevices = Pa_GetDeviceCount();
    if( numDevices < 0 )
    {
        printf( "ERROR: Pa_GetDeviceCount returned 0x%x\n", numDevices );
        err = numDevices;
        goto error;
    }
    
    printf( "Number of devices = %d\n", numDevices );
    for( i=0; i<numDevices; i++ )
    {
        deviceInfo = Pa_GetDeviceInfo( i );
        printf( "--------------------------------------- device #%d\n", i );
                
    /* Mark global and API specific default devices */
        defaultDisplayed = 0;
        if( i == Pa_GetDefaultInputDevice() )
        {
            printf( "[ Default Input" );
            defaultDisplayed = 1;
        }
        else if( i == Pa_GetHostApiInfo( deviceInfo->hostApi )->defaultInputDevice )
        {
            const PaHostApiInfo *hostInfo = Pa_GetHostApiInfo( deviceInfo->hostApi );
            printf( "[ Default %s Input", hostInfo->name );
            defaultDisplayed = 1;
        }
        
        if( i == Pa_GetDefaultOutputDevice() )
        {
            printf( (defaultDisplayed ? "," : "[") );
            printf( " Default Output" );
            defaultDisplayed = 1;
        }
        else if( i == Pa_GetHostApiInfo( deviceInfo->hostApi )->defaultOutputDevice )
        {
            const PaHostApiInfo *hostInfo = Pa_GetHostApiInfo( deviceInfo->hostApi );
            printf( (defaultDisplayed ? "," : "[") );                
            printf( " Default %s Output", hostInfo->name );
            defaultDisplayed = 1;
        }

        if( defaultDisplayed )
            printf( " ]\n" );

    /* print device info fields */
#ifdef WIN32
        {   /* Use wide char on windows, so we can show UTF-8 encoded device names */
            wchar_t wideName[MAX_PATH];
            MultiByteToWideChar(CP_UTF8, 0, deviceInfo->name, -1, wideName, MAX_PATH-1);
            wprintf( L"Name                        = %s\n", wideName );
        }
#else
        printf( "Name                        = %s\n", deviceInfo->name );
#endif
        printf( "Host API                    = %s\n",  Pa_GetHostApiInfo( deviceInfo->hostApi )->name );
        printf( "Max inputs = %d", deviceInfo->maxInputChannels  );
        printf( ", Max outputs = %d\n", deviceInfo->maxOutputChannels  );

        printf( "Default low input latency   = %8.4f\n", deviceInfo->defaultLowInputLatency  );
        printf( "Default low output latency  = %8.4f\n", deviceInfo->defaultLowOutputLatency  );
        printf( "Default high input latency  = %8.4f\n", deviceInfo->defaultHighInputLatency  );
        printf( "Default high output latency = %8.4f\n", deviceInfo->defaultHighOutputLatency  );

#ifdef WIN32
#if PA_USE_ASIO
/* ASIO specific latency information */
        if( Pa_GetHostApiInfo( deviceInfo->hostApi )->type == paASIO ){
            long minLatency, maxLatency, preferredLatency, granularity;

            err = PaAsio_GetAvailableLatencyValues( i,
		            &minLatency, &maxLatency, &preferredLatency, &granularity );

            printf( "ASIO minimum buffer size    = %ld\n", minLatency  );
            printf( "ASIO maximum buffer size    = %ld\n", maxLatency  );
            printf( "ASIO preferred buffer size  = %ld\n", preferredLatency  );

            if( granularity == -1 )
                printf( "ASIO buffer granularity     = power of 2\n" );
            else
                printf( "ASIO buffer granularity     = %ld\n", granularity  );
        }
#endif /* PA_USE_ASIO */
#endif /* WIN32 */

        printf( "Default sample rate         = %8.2f\n", deviceInfo->defaultSampleRate );

    /* poll for standard sample rates */
        inputParameters.device = i;
        inputParameters.channelCount = deviceInfo->maxInputChannels;
        inputParameters.sampleFormat = paInt16;
        inputParameters.suggestedLatency = 0; /* ignored by Pa_IsFormatSupported() */
        inputParameters.hostApiSpecificStreamInfo = NULL;
        
        outputParameters.device = i;
        outputParameters.channelCount = deviceInfo->maxOutputChannels;
        outputParameters.sampleFormat = paInt16;
        outputParameters.suggestedLatency = 0; /* ignored by Pa_IsFormatSupported() */
        outputParameters.hostApiSpecificStreamInfo = NULL;

        if( inputParameters.channelCount > 0 )
        {
            printf("Supported standard sample rates\n for half-duplex 16 bit %d channel input = \n",
                    inputParameters.channelCount );
            PrintSupportedStandardSampleRates( &inputParameters, NULL );
        }

        if( outputParameters.channelCount > 0 )
        {
            printf("Supported standard sample rates\n for half-duplex 16 bit %d channel output = \n",
                    outputParameters.channelCount );
            PrintSupportedStandardSampleRates( NULL, &outputParameters );
        }

        if( inputParameters.channelCount > 0 && outputParameters.channelCount > 0 )
        {
            printf("Supported standard sample rates\n for full-duplex 16 bit %d channel input, %d channel output = \n",
                    inputParameters.channelCount, outputParameters.channelCount );
            PrintSupportedStandardSampleRates( &inputParameters, &outputParameters );
        }
    }

    Pa_Terminate();

    printf("----------------------------------------------\n");
    return 0;

error:
    Pa_Terminate();
    fprintf( stderr, "Error number: %d\n", err );
    fprintf( stderr, "Error message: %s\n", Pa_GetErrorText( err ) );
    return err;
}